

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptional.cxx
# Opt level: O3

void __thiscall EventLogger::~EventLogger(EventLogger *this)

{
  Event local_20;
  
  local_20.Type = DESTRUCT;
  local_20.Logger2 = (EventLogger *)0x0;
  local_20.Value = this->Value;
  if (events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    local_20.Logger1 = this;
    std::vector<Event,_std::allocator<Event>_>::_M_realloc_insert<Event>
              (&events,(iterator)
                       events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_20);
  }
  else {
    (events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.super__Vector_impl_data.
    _M_finish)->Logger2 = (EventLogger *)0x0;
    *(ulong *)&(events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.
                super__Vector_impl_data._M_finish)->Value = CONCAT44(local_20._28_4_,local_20.Value)
    ;
    *(ulong *)events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.
              super__Vector_impl_data._M_finish = CONCAT44(local_20._4_4_,4);
    (events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.super__Vector_impl_data.
    _M_finish)->Logger1 = this;
    events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.super__Vector_impl_data.
    _M_finish = events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

EventLogger::~EventLogger()
{
  BEGIN_IGNORE_UNINITIALIZED
  events.push_back({ Event::DESTRUCT, this, nullptr, this->Value });
  END_IGNORE_UNINITIALIZED
}